

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void vkt::image::anon_unknown_0::flipHorizontally(PixelBufferAccess *access)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  VkFormat format;
  int iVar6;
  TextureFormat *format_00;
  int x_00;
  undefined1 local_70 [16];
  undefined1 local_60 [8];
  Vec4 temp_1;
  int x_1;
  int y_1;
  int z_1;
  undefined1 local_34 [8];
  UVec4 temp;
  int x;
  int y;
  int z;
  int halfWidth;
  int xMax;
  PixelBufferAccess *access_local;
  
  iVar4 = tcu::ConstPixelBufferAccess::getWidth(&access->super_ConstPixelBufferAccess);
  iVar4 = iVar4 + -1;
  iVar5 = tcu::ConstPixelBufferAccess::getWidth(&access->super_ConstPixelBufferAccess);
  format_00 = tcu::ConstPixelBufferAccess::getFormat(&access->super_ConstPixelBufferAccess);
  format = ::vk::mapTextureFormat(format_00);
  bVar3 = isIntegerFormat(format);
  x_00 = (int)access;
  if (bVar3) {
    for (x = 0; iVar6 = tcu::ConstPixelBufferAccess::getDepth(&access->super_ConstPixelBufferAccess)
        , x < iVar6; x = x + 1) {
      for (temp.m_data[3] = 0; uVar2 = temp.m_data[3],
          iVar6 = tcu::ConstPixelBufferAccess::getHeight(&access->super_ConstPixelBufferAccess),
          (int)uVar2 < iVar6; temp.m_data[3] = temp.m_data[3] + 1) {
        for (temp.m_data[2] = 0; (int)temp.m_data[2] < iVar5 / 2;
            temp.m_data[2] = temp.m_data[2] + 1) {
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_34,x_00,iVar4 - temp.m_data[2],temp.m_data[3]);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&y_1,x_00,temp.m_data[2],temp.m_data[3]);
          tcu::PixelBufferAccess::setPixel
                    (access,(UVec4 *)&y_1,iVar4 - temp.m_data[2],temp.m_data[3],x);
          tcu::PixelBufferAccess::setPixel(access,(UVec4 *)local_34,temp.m_data[2],temp.m_data[3],x)
          ;
        }
      }
    }
  }
  else {
    for (x_1 = 0; iVar6 = tcu::ConstPixelBufferAccess::getDepth
                                    (&access->super_ConstPixelBufferAccess), x_1 < iVar6;
        x_1 = x_1 + 1) {
      for (temp_1.m_data[3] = 0.0; fVar1 = temp_1.m_data[3],
          iVar6 = tcu::ConstPixelBufferAccess::getHeight(&access->super_ConstPixelBufferAccess),
          (int)fVar1 < iVar6; temp_1.m_data[3] = (float)((int)temp_1.m_data[3] + 1)) {
        for (temp_1.m_data[2] = 0.0; (int)temp_1.m_data[2] < iVar5 / 2;
            temp_1.m_data[2] = (float)((int)temp_1.m_data[2] + 1)) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_60,x_00,iVar4 - (int)temp_1.m_data[2],
                     (int)temp_1.m_data[3]);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_70,x_00,(int)temp_1.m_data[2],
                     (int)temp_1.m_data[3]);
          tcu::PixelBufferAccess::setPixel
                    (access,(Vec4 *)local_70,iVar4 - (int)temp_1.m_data[2],(int)temp_1.m_data[3],x_1
                    );
          tcu::PixelBufferAccess::setPixel
                    (access,(Vec4 *)local_60,(int)temp_1.m_data[2],(int)temp_1.m_data[3],x_1);
        }
      }
    }
  }
  return;
}

Assistant:

void flipHorizontally (const tcu::PixelBufferAccess access)
{
	const int xMax = access.getWidth() - 1;
	const int halfWidth = access.getWidth() / 2;

	if (isIntegerFormat(mapTextureFormat(access.getFormat())))
		for (int z = 0; z < access.getDepth(); z++)
		for (int y = 0; y < access.getHeight(); y++)
		for (int x = 0; x < halfWidth; x++)
		{
			const tcu::UVec4 temp = access.getPixelUint(xMax - x, y, z);
			access.setPixel(access.getPixelUint(x, y, z), xMax - x, y, z);
			access.setPixel(temp, x, y, z);
		}
	else
		for (int z = 0; z < access.getDepth(); z++)
		for (int y = 0; y < access.getHeight(); y++)
		for (int x = 0; x < halfWidth; x++)
		{
			const tcu::Vec4 temp = access.getPixel(xMax - x, y, z);
			access.setPixel(access.getPixel(x, y, z), xMax - x, y, z);
			access.setPixel(temp, x, y, z);
		}
}